

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O0

DecodeStatus DecodeCondRegisterZero(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus ret;
  void *Decoder_local;
  uint64_t Address_local;
  uint Val_local;
  MCInst *Inst_local;
  DecodeStatus local_4;
  
  ret = MCDisassembler_Success;
  if (Inst->flat_insn->detail == (cs_detail *)0x0) {
    local_4 = MCDisassembler_Success;
  }
  else {
    if (Val == 0) {
      (Inst->flat_insn->detail->field_6).x86.operands[4].type = X86_OP_INVALID;
    }
    else if (Val == 1) {
      (Inst->flat_insn->detail->field_6).x86.operands[4].type = X86_OP_REG;
    }
    else {
      (Inst->flat_insn->detail->field_6).x86.operands[4].type = X86_OP_INVALID;
      ret = MCDisassembler_Fail;
    }
    local_4 = ret;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeCondRegisterZero(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	DecodeStatus ret = MCDisassembler_Success;

	if(!Inst->flat_insn->detail)
		return MCDisassembler_Success;

	switch(Val) {
		case 0:
			Inst->flat_insn->detail->tms320c64x.condition.zero = 0;
			break;
		case 1:
			Inst->flat_insn->detail->tms320c64x.condition.zero = 1;
			break;
		default:
			Inst->flat_insn->detail->tms320c64x.condition.zero = 0;
			ret = MCDisassembler_Fail;
			break;
	}

	return ret;
}